

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

NodeAndBucket __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
FindHelper(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,ViewType k,TreeIterator *it)

{
  uint b_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  NodeAndBucket NVar2;
  RealKeyToVariantKey<std::__cxx11::string> local_69;
  VariantKey local_68;
  NodeBase *local_58;
  NodeBase *node;
  char *local_48;
  uint local_3c;
  TreeIterator *pTStack_38;
  map_index_t b;
  TreeIterator *it_local;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  ViewType k_local;
  map_index_t local_10;
  
  local_48 = k._M_str;
  node = (NodeBase *)k._M_len;
  pTStack_38 = it;
  it_local = (TreeIterator *)this;
  this_local = (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)node;
  k_local._M_len = (size_t)local_48;
  local_3c = BucketNumber(this,k);
  bVar1 = internal::UntypedMapBase::TableEntryIsNonEmptyList(&this->super_UntypedMapBase,local_3c);
  if (bVar1) {
    local_58 = TableEntryToNode((this->super_UntypedMapBase).table_[local_3c]);
    do {
      t = KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::key((KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_58);
      bVar1 = TransparentSupport<std::__cxx11::string>::
              Equals<std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>
                        (t,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      if (bVar1) {
        k_local._M_str = (char *)local_58;
        local_10 = local_3c;
        goto LAB_001d414c;
      }
      local_58 = local_58->next;
    } while (local_58 != (NodeBase *)0x0);
  }
  else {
    bVar1 = internal::UntypedMapBase::TableEntryIsTree(&this->super_UntypedMapBase,local_3c);
    b_00 = local_3c;
    if (bVar1) {
      local_68 = RealKeyToVariantKey<std::__cxx11::string>::operator()
                           (&local_69,
                            (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      NVar2 = internal::UntypedMapBase::FindFromTree
                        (&this->super_UntypedMapBase,b_00,local_68,pTStack_38);
      k_local._M_str = (char *)NVar2.node;
      local_10 = NVar2.bucket;
      goto LAB_001d414c;
    }
  }
  k_local._M_str = (char *)0x0;
  local_10 = local_3c;
LAB_001d414c:
  NVar2.bucket = local_10;
  NVar2.node = (NodeBase *)k_local._M_str;
  NVar2._12_4_ = 0;
  return NVar2;
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k,
                           TreeIterator* it = nullptr) const {
    map_index_t b = BucketNumber(k);
    if (TableEntryIsNonEmptyList(b)) {
      auto* node = internal::TableEntryToNode(table_[b]);
      do {
        if (TS::Equals(static_cast<KeyNode*>(node)->key(), k)) {
          return {node, b};
        } else {
          node = node->next;
        }
      } while (node != nullptr);
    } else if (TableEntryIsTree(b)) {
      return FindFromTree(b, internal::RealKeyToVariantKey<Key>{}(k), it);
    }
    return {nullptr, b};
  }